

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O1

void __thiscall netbase_tests::netpermissions_test::test_method(netpermissions_test *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  NetPermissionFlags flags;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  check_type cVar7;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  char local_d14 [4];
  undefined1 local_d10 [24];
  char *local_cf8;
  char *local_cf0;
  undefined1 *local_ce8;
  undefined1 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  undefined1 *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  assertion_result local_578;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  ConnectionDirection connection_direction;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  char *local_228;
  assertion_result local_220;
  NetWhitebindPermissions *local_208;
  NetWhitebindPermissions *local_200;
  NetWhitelistPermissions *local_1f8;
  char *local_1f0;
  undefined1 local_1e8 [32];
  NetWhitebindPermissions download;
  NetWhitebindPermissions download_noban;
  NetWhitebindPermissions noban_download;
  NetWhitebindPermissions noban;
  NetWhitelistPermissions whitelistPermissions;
  NetWhitebindPermissions whitebindPermissions;
  bilingual_str error;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  CService::CService(&whitebindPermissions.m_service);
  CSubNet::CSubNet(&whitelistPermissions.m_subnet);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x174;
  file.m_begin = (iterator)&local_258;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"");
  _cVar7 = 0x4fec38;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f8bf;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_270 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_278,0x174);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x175;
  file_00.m_begin = (iterator)&local_288;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  _cVar7 = 0x4fed4f;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Cannot resolve -whitebind address",0,0x21);
  noban_download.super_NetPermissions.m_flags._0_1_ = sVar3 != 0xffffffffffffffff;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_103f8d9;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_2a8,0x175);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x176;
  file_01.m_begin = (iterator)&local_2b8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c8,
             msg_01);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"127.0.0.1","");
  _cVar7 = 0x4fee5c;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f8f4;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2d0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_2d8,0x176);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x177;
  file_02.m_begin = (iterator)&local_2e8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f8,
             msg_02);
  _cVar7 = 0x4fef74;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Need to specify a port with -whitebind",0,0x26);
  noban_download.super_NetPermissions.m_flags._0_1_ = sVar3 != 0xffffffffffffffff;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_103f91c;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_300 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_308,0x177);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x178;
  file_03.m_begin = (iterator)&local_318;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_328,
             msg_03);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"");
  _cVar7 = 0x4ff07d;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = !bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f8bf;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_330 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_338,0x178);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x17b;
  file_04.m_begin = (iterator)&local_348;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_358,
             msg_04);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"1.2.3.4:32","");
  _cVar7 = 0x4ff1ac;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f944;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_360 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_368,0x17b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x4ff2a7;
  file_05.m_end = (iterator)0x17c;
  file_05.m_begin = (iterator)&local_378;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  noban_download.super_NetPermissions.m_flags._0_1_ = error.original._M_string_length == 0;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = (long)"!error.empty()" + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_390 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_398,0x17c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x17d;
  file_06.m_begin = (iterator)&local_3a8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3b8,
             msg_06);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  download_noban._0_8_ = &PTR__lazy_ostream_013abb30;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  download_noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  download._0_8_ = download._0_8_ & 0xffffffffffffff00;
  local_578._0_8_ = local_1e8;
  local_1e8._0_4_ = Implicit;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_58._8_8_ = "";
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &local_220;
  local_220._0_8_ = &whitebindPermissions;
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013ae918;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &local_578;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013ae918;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download,(lazy_ostream *)&download_noban,1,2,REQUIRE,0xeb79f8,
             (size_t)local_58,0x17d,&noban,"NetPermissionFlags::Implicit",&noban_download);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download.m_service.super_CNetAddr.m_addr._union + 8));
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x4ff4d0;
  file_07.m_end = (iterator)0x17e;
  file_07.m_begin = (iterator)&local_3c8;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3d8,
             msg_07);
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ =
       (long)"!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit)"
       + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  noban_download.super_NetPermissions.m_flags._0_1_ =
       (char)(whitebindPermissions.super_NetPermissions.m_flags >> 0x1f);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_3e8,0x17e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  whitebindPermissions.super_NetPermissions.m_flags =
       whitebindPermissions.super_NetPermissions.m_flags & ~Implicit;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x4ff5aa;
  file_08.m_end = (iterator)0x180;
  file_08.m_begin = (iterator)&local_3f8;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_408,
             msg_08);
  noban_download.super_NetPermissions.m_flags._0_1_ =
       -1 < (int)whitebindPermissions.super_NetPermissions.m_flags;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ = anon_var_dwarf_103f993;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_410 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_418,0x180);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x181;
  file_09.m_begin = (iterator)&local_428;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_438,
             msg_09);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  download_noban._0_8_ = &PTR__lazy_ostream_013abb30;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  download_noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  download.super_NetPermissions.m_flags._0_1_ =
       whitebindPermissions.super_NetPermissions.m_flags == None;
  local_1e8._0_8_ = (ulong)(uint)local_1e8._4_4_ << 0x20;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_58._8_8_ = "";
  local_220._0_8_ = &whitebindPermissions;
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013ae918;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &local_220;
  local_578._0_8_ = local_1e8;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013ae918;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &local_578;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download,(lazy_ostream *)&download_noban,1,2,REQUIRE,0xeb79f8,
             (size_t)local_58,0x181,&noban,"NetPermissionFlags::None",&noban_download);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download.m_service.super_CNetAddr.m_addr._union + 8));
  whitebindPermissions.super_NetPermissions.m_flags =
       whitebindPermissions.super_NetPermissions.m_flags | Implicit;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x4ff7e3;
  file_10.m_end = (iterator)0x183;
  file_10.m_begin = (iterator)&local_448;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_458,
             msg_10);
  noban_download.super_NetPermissions.m_flags._0_1_ =
       (byte)(whitebindPermissions.super_NetPermissions.m_flags >> 0x1f);
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download_noban._0_8_ =
       (long)"!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit)"
       + 1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013abc70;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_460 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&noban_download,(lazy_ostream *)&noban,1,0,WARN,_cVar7,
             (size_t)&local_468,0x183);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&noban_download.m_service.super_CNetAddr.m_addr._union + 8));
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x186;
  file_11.m_begin = (iterator)&local_478;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_488,
             msg_11);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"bloom@1.2.3.4:32","");
  _cVar7 = 0x4ff8fb;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f9c8;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_490 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_498,0x186);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x187;
  file_12.m_begin = (iterator)&local_4a8;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4b8,
             msg_12);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  download_noban._0_8_ = &PTR__lazy_ostream_013abb30;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  download_noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  download.super_NetPermissions.m_flags._0_1_ =
       whitebindPermissions.super_NetPermissions.m_flags == BloomFilter;
  local_1e8._0_4_ = 2;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_58._8_8_ = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013ae918;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &local_220;
  local_578._0_8_ = local_1e8;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013ae918;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &local_578;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_220._0_8_ = &whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download,(lazy_ostream *)&download_noban,1,2,REQUIRE,0xeb79f8,
             (size_t)local_58,0x187,&noban,"NetPermissionFlags::BloomFilter",&noban_download);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download.m_service.super_CNetAddr.m_addr._union + 8));
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x188;
  file_13.m_begin = (iterator)&local_4c8;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4d8,
             msg_13);
  noban._0_8_ = (long)&noban.m_service.super_CNetAddr.m_addr._union + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&noban,"@1.2.3.4:32","");
  _cVar7 = 0x4ffb90;
  bVar1 = NetWhitebindPermissions::TryParse((string *)&noban,&whitebindPermissions,&error);
  download_noban.super_NetPermissions.m_flags._0_1_ = bVar1;
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  download._0_8_ = anon_var_dwarf_103f9ef;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = "";
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013abc70;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download_noban,(lazy_ostream *)&noban_download,1,0,WARN,_cVar7,
             (size_t)&local_4e8,0x188);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download_noban.m_service.super_CNetAddr.m_addr._union + 8));
  if ((undefined1 *)noban._0_8_ !=
      (undefined1 *)((long)&noban.m_service.super_CNetAddr.m_addr._union + 8)) {
    operator_delete((void *)noban._0_8_,noban.m_service.super_CNetAddr.m_addr._union._8_8_ + 1);
  }
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x189;
  file_14.m_begin = (iterator)&local_4f8;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_508,
             msg_14);
  download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  download_noban._0_8_ = &PTR__lazy_ostream_013abb30;
  download_noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  download_noban.m_service.super_CNetAddr.m_addr._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  download.super_NetPermissions.m_flags._0_1_ =
       whitebindPermissions.super_NetPermissions.m_flags == None;
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  download.m_service.super_CNetAddr.m_addr._union._8_8_ = 0;
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_58._8_8_ = "";
  noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect &
               0xffffffffffffff00);
  noban._0_8_ = &PTR__lazy_ostream_013ae918;
  noban.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  noban.m_service.super_CNetAddr.m_addr._16_8_ = &local_220;
  local_578._0_8_ = local_1e8;
  noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.
                       indirect & 0xffffffffffffff00);
  noban_download._0_8_ = &PTR__lazy_ostream_013ae918;
  noban_download.m_service.super_CNetAddr.m_addr._union._8_8_ = boost::unit_test::lazy_ostream::inst
  ;
  noban_download.m_service.super_CNetAddr.m_addr._16_8_ = &local_578;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_220._0_8_ = &whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&download,(lazy_ostream *)&download_noban,1,2,REQUIRE,0xeb79f8,
             (size_t)local_58,0x189,&noban,"NetPermissionFlags::None",&noban_download);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&download.m_service.super_CNetAddr.m_addr._union + 8));
  CService::CService(&noban.m_service);
  CService::CService(&noban_download.m_service);
  CService::CService(&download_noban.m_service);
  CService::CService(&download.m_service);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x18e;
  file_15.m_begin = (iterator)&local_518;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_528,
             msg_15);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"noban@1.2.3.4:32","");
  _cVar7 = 0x4ffe50;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&noban,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ = "NetWhitebindPermissions::TryParse(\"noban@1.2.3.4:32\", noban, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_530 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,2,0,WARN,_cVar7,(size_t)&local_538,0x18e);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x18f;
  file_16.m_begin = (iterator)&local_548;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_558,
             msg_16);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_228 = (char *)CONCAT44(local_228._4_4_,NoBan);
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(noban.super_NetPermissions.m_flags == NoBan);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_48._8_8_ = &local_1f8;
  local_1f8 = (NetWhitelistPermissions *)&noban;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb7d3d,
             (size_t)&strings,399,(string *)local_58,"NetPermissionFlags::NoBan",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x5000af;
  file_17.m_end = (iterator)0x190;
  file_17.m_begin = (iterator)&local_588;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_598,
             msg_17);
  local_220._0_8_ =
       CONCAT71(local_220._1_7_,(byte)(undefined1)noban.super_NetPermissions.m_flags >> 6) &
       0xffffffffffffff01;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::Download)";
  local_578.m_message.px = (element_type *)0xeb7bfa;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_5a8,400);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x500180;
  file_18.m_end = (iterator)0x191;
  file_18.m_begin = (iterator)&local_5b8;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5c8,
             msg_18);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((~noban.super_NetPermissions.m_flags & 0x50) == 0);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::NoBan)";
  local_578.m_message.px = (element_type *)0xeb7c3c;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5d0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_5d8,0x191);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x194;
  file_19.m_begin = (iterator)&local_5e8;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5f8,
             msg_19);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"noban,download@1.2.3.4:32","")
  ;
  _cVar7 = 0x50029a;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&noban_download,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"noban,download@1.2.3.4:32\", noban_download, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_600 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,2,0,WARN,_cVar7,(size_t)&local_608,0x194);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x195;
  file_20.m_begin = (iterator)&local_618;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_628,
             msg_20);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (noban_download.super_NetPermissions.m_flags == noban.super_NetPermissions.m_flags)
  ;
  local_560 = "";
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = &noban;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&noban_download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb7cad,
             (size_t)&strings,0x195,(string *)local_58,"noban.m_flags",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x198;
  file_21.m_begin = (iterator)&local_638;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_648,
             msg_21);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"download,noban@1.2.3.4:32","")
  ;
  _cVar7 = 0x500531;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&download_noban,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"download,noban@1.2.3.4:32\", download_noban, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_650 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,2,0,WARN,_cVar7,(size_t)&local_658,0x198);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x199;
  file_22.m_begin = (iterator)&local_668;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_678,
             msg_22);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (download_noban.super_NetPermissions.m_flags == noban.super_NetPermissions.m_flags)
  ;
  local_560 = "";
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = &noban;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&download_noban;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb7d34,
             (size_t)&strings,0x199,(string *)local_58,"noban.m_flags",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x19c;
  file_23.m_begin = (iterator)&local_688;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_698,
             msg_23);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"download@1.2.3.4:32","");
  _cVar7 = 0x5007bb;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&download,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ = "NetWhitebindPermissions::TryParse(\"download@1.2.3.4:32\", download, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6a0 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,2,0,WARN,_cVar7,(size_t)&local_6a8,0x19c);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x19d;
  file_24.m_begin = (iterator)&local_6b8;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_6c8,
             msg_24);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(download.super_NetPermissions.m_flags == Download);
  local_228 = (char *)CONCAT44(local_228._4_4_,Download);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&download;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb7cb3,
             (size_t)&strings,0x19d,local_58,"NetPermissionFlags::Download",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x500a18;
  file_25.m_end = (iterator)0x19e;
  file_25.m_begin = (iterator)&local_6d8;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6e8,
             msg_25);
  local_220._0_8_ =
       CONCAT71(local_220._1_7_,(byte)(undefined1)download.super_NetPermissions.m_flags >> 6) &
       0xffffffffffffff01;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::Download)";
  local_578.m_message.px = (element_type *)0xeb7ddc;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_6f0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_6f8,0x19e);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x500aec;
  file_26.m_end = (iterator)0x19f;
  file_26.m_begin = (iterator)&local_708;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_718,
             msg_26);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((~download.super_NetPermissions.m_flags & 0x50) != 0);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "!NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::NoBan)";
  local_578.m_message.px = (element_type *)0xeb7e22;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_720 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_728,0x19f);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x1a2;
  file_27.m_begin = (iterator)&local_738;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_748,
             msg_27);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay@1.2.3.4:32","");
  _cVar7 = 0x500c06;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"bloom,forcerelay@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_750 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_758,0x1a2);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x1a4;
  file_28.m_begin = (iterator)&local_768;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_778,
             msg_28);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (whitebindPermissions.super_NetPermissions.m_flags == (ForceRelay|BloomFilter));
  local_228 = (char *)CONCAT44(local_228._4_4_,ForceRelay|BloomFilter);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1a4,(string *)local_58,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay"
             ,&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x1a5;
  file_29.m_begin = (iterator)&local_788;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_798,
             msg_29);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,relay,noban@1.2.3.4:32","");
  _cVar7 = 0x500e99;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"bloom,relay,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_7a8,0x1a5);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x1a6;
  file_30.m_begin = (iterator)&local_7b8;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7c8,
             msg_30);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (whitebindPermissions.super_NetPermissions.m_flags == (NoBan|Relay|BloomFilter));
  local_228 = (char *)CONCAT44(local_228._4_4_,NoBan|Relay|BloomFilter);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1a6,(string *)local_58,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan"
             ,&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x1a7;
  file_31.m_begin = (iterator)&local_7d8;
  msg_31.m_end = pvVar6;
  msg_31.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7e8,
             msg_31);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay,noban@1.2.3.4:32","");
  _cVar7 = 0x501126;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"bloom,forcerelay,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_7f0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_7f8,0x1a7);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x1a8;
  file_32.m_begin = (iterator)&local_808;
  msg_32.m_end = pvVar6;
  msg_32.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_818,
             msg_32);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"all@1.2.3.4:32","");
  _cVar7 = 0x501267;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"all@1.2.3.4:32\", whitebindPermissions, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_820 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_828,0x1a8);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x1a9;
  file_33.m_begin = (iterator)&local_838;
  msg_33.m_end = pvVar6;
  msg_33.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_848,
             msg_33);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(whitebindPermissions.super_NetPermissions.m_flags == All);
  local_228 = (char *)CONCAT44(local_228._4_4_,All);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1a9,(string *)local_58,"NetPermissionFlags::All",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x1ac;
  file_34.m_begin = (iterator)&local_858;
  msg_34.m_end = pvVar6;
  msg_34.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_868,
             msg_34);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,relay,noban,noban@1.2.3.4:32","");
  _cVar7 = 0x501509;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"bloom,relay,noban,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_870 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_878,0x1ac);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x1ad;
  file_35.m_begin = (iterator)&local_888;
  msg_35.m_end = pvVar6;
  msg_35.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_898,
             msg_35);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (whitebindPermissions.super_NetPermissions.m_flags == (NoBan|Relay|BloomFilter));
  local_228 = (char *)CONCAT44(local_228._4_4_,NoBan|Relay|BloomFilter);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1ad,(string *)local_58,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download"
             ,&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_8a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x1b0;
  file_36.m_begin = (iterator)&local_8a8;
  msg_36.m_end = pvVar6;
  msg_36.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_8b8,
             msg_36);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,relay,,noban@1.2.3.4:32","");
  _cVar7 = 0x5017a1;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\"bloom,relay,,noban@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8c0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_8c8,0x1b0);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8d0 = "";
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x1b1;
  file_37.m_begin = (iterator)&local_8d8;
  msg_37.m_end = pvVar6;
  msg_37.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8e8,
             msg_37);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (whitebindPermissions.super_NetPermissions.m_flags == (NoBan|Relay|BloomFilter));
  local_228 = (char *)CONCAT44(local_228._4_4_,0x5a);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1b1,(string *)local_58,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan"
             ,&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x1b2;
  file_38.m_begin = (iterator)&local_8f8;
  msg_38.m_end = pvVar6;
  msg_38.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_908,
             msg_38);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,",@1.2.3.4:32","");
  _cVar7 = 0x501a38;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\",@1.2.3.4:32\", whitebindPermissions, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_910 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_918,0x1b2);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x1b3;
  file_39.m_begin = (iterator)&local_928;
  msg_39.m_end = pvVar6;
  msg_39.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_938,
             msg_39);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(whitebindPermissions.super_NetPermissions.m_flags == None);
  local_228 = (char *)((ulong)local_228 & 0xffffffff00000000);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1b3,(string *)local_58,"NetPermissionFlags::None",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_948 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x1b4;
  file_40.m_begin = (iterator)&local_948;
  msg_40.m_end = pvVar6;
  msg_40.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_958,
             msg_40);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,",,@1.2.3.4:32","");
  _cVar7 = 0x501ccf;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitebindPermissions::TryParse(\",,@1.2.3.4:32\", whitebindPermissions, error)";
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_960 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_968,0x1b4);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_978 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_970 = "";
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x1b5;
  file_41.m_begin = (iterator)&local_978;
  msg_41.m_end = pvVar6;
  msg_41.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_988,
             msg_41);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(whitebindPermissions.super_NetPermissions.m_flags == None);
  local_228 = (char *)((ulong)local_228 & 0xffffffff00000000);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&whitebindPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb79f8,
             (size_t)&strings,0x1b5,(string *)local_58,"NetPermissionFlags::None",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x1b7;
  file_42.m_begin = (iterator)&local_998;
  msg_42.m_end = pvVar6;
  msg_42.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_9a8,
             msg_42);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"out,forcerelay@1.2.3.4:32","")
  ;
  _cVar7 = 0x501f60;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "!NetWhitebindPermissions::TryParse(\"out,forcerelay@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9b0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_9b8,0x1b7);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x1b8;
  file_43.m_begin = (iterator)&local_9c8;
  msg_43.m_end = pvVar6;
  msg_43.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_9d8,
             msg_43);
  _cVar7 = 0x502078;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,
                     "whitebind may only be used for incoming connections (\"out\" was passed)",0,
                     0x46);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ =
       "error.original.find(\"whitebind may only be used for incoming connections (\\\"out\\\" was passed)\") != std::string::npos"
  ;
  local_578.m_message.px = (element_type *)0xeb8428;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = &local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_9e8,0x1b8);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x1bb;
  file_44.m_begin = (iterator)&local_9f8;
  msg_44.m_end = pvVar6;
  msg_44.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a08,
             msg_44);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay,oopsie@1.2.3.4:32","");
  _cVar7 = 0x502185;
  bVar1 = NetWhitebindPermissions::TryParse((string *)local_58,&whitebindPermissions,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "!NetWhitebindPermissions::TryParse(\"bloom,forcerelay,oopsie@1.2.3.4:32\", whitebindPermissions, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a10 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_a18,0x1bb);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_a28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a20 = "";
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x1bc;
  file_45.m_begin = (iterator)&local_a28;
  msg_45.m_end = pvVar6;
  msg_45.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_a38,
             msg_45);
  _cVar7 = 0x50229d;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Invalid P2P permission",0,0x16);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "error.original.find(\"Invalid P2P permission\") != std::string::npos";
  local_578.m_message.px = (element_type *)0xeb850b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a40 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = &local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_a48,0x1bc);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x1bf;
  file_46.m_begin = (iterator)&local_a58;
  msg_46.m_end = pvVar6;
  msg_46.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_a68,
             msg_46);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay,noban@1.2.3.4:32","");
  _cVar7 = 0x5023b2;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "!NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban@1.2.3.4:32\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a70 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_a78,0x1bf);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x1c0;
  file_47.m_begin = (iterator)&local_a88;
  msg_47.m_end = pvVar6;
  msg_47.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_a98,
             msg_47);
  _cVar7 = 0x5024ca;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&error.original,"Invalid netmask specified in -whitelist",0,0x27);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 != 0xffffffffffffffff);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ =
       "error.original.find(\"Invalid netmask specified in -whitelist\") != std::string::npos";
  local_578.m_message.px = (element_type *)0xeb8602;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_aa0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = &local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_aa8,0x1c0);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_ab8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ab0 = "";
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x1c3;
  file_48.m_begin = (iterator)&local_ab8;
  msg_48.m_end = pvVar6;
  msg_48.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_ac8,
             msg_48);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"noban@1.2.3.4","");
  _cVar7 = 0x5025e2;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"noban@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ad8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ad0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_ad8,0x1c3);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_ae8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x1c4;
  file_49.m_begin = (iterator)&local_ae8;
  msg_49.m_end = pvVar6;
  msg_49.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_af8,
             msg_49);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)(whitelistPermissions.super_NetPermissions.m_flags == NoBan);
  local_228 = (char *)CONCAT44(local_228._4_4_,NoBan);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = &whitelistPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8677,
             (size_t)&strings,0x1c4,local_58,"NetPermissionFlags::NoBan",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x50283e;
  file_50.m_end = (iterator)0x1c5;
  file_50.m_begin = (iterator)&local_b08;
  msg_50.m_end = pvVar6;
  msg_50.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_b18,
             msg_50);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((~whitelistPermissions.super_NetPermissions.m_flags & 0x50) == 0);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ =
       "NetPermissions::HasFlag(whitelistPermissions.m_flags, NetPermissionFlags::NoBan)";
  local_578.m_message.px = (element_type *)0xeb86e4;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b20 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_b28,0x1c5);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b30 = "";
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x1c7;
  file_51.m_begin = (iterator)&local_b38;
  msg_51.m_end = pvVar6;
  msg_51.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_b48,
             msg_51);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay,noban,relay@1.2.3.4/32","");
  _cVar7 = 0x502960;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban,relay@1.2.3.4/32\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_b58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b50 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_b58,0x1c7);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b60 = "";
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x1c8;
  file_52.m_begin = (iterator)&local_b68;
  msg_52.m_end = pvVar6;
  msg_52.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_b78,
             msg_52);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 (whitelistPermissions.super_NetPermissions.m_flags ==
                 (NoBan|ForceRelay|BloomFilter));
  local_228 = (char *)CONCAT44(local_228._4_4_,NoBan|ForceRelay|BloomFilter);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae918;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae918;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = &whitelistPermissions;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8677,
             (size_t)&strings,0x1c8,(string *)local_58,
             "NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay"
             ,&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x502bb5;
  file_53.m_end = (iterator)0x1c9;
  file_53.m_begin = (iterator)&local_b88;
  msg_53.m_end = pvVar6;
  msg_53.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_b98,
             msg_53);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(error.original._M_string_length == 0);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "error.empty()";
  local_578.m_message.px = (element_type *)0x1102e69;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ba0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_ba8,0x1c9);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_bb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_bb0 = "";
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x1ca;
  file_54.m_begin = (iterator)&local_bb8;
  msg_54.m_end = pvVar6;
  msg_54.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_bc8,
             msg_54);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  CSubNet::ToString_abi_cxx11_((string *)local_1e8,&whitelistPermissions.m_subnet);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     "1.2.3.4/32");
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar2 == 0);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = (NetWhitelistPermissions *)0xeb4c4d;
  local_1f0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_200;
  local_228 = "1.2.3.4/32";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ad200;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_228;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_200 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strings,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8806,
             (size_t)&local_1f8,0x1ca,(lazy_ostream *)local_58,"\"1.2.3.4/32\"",&local_220);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((shared_count *)local_1e8._0_8_ != (shared_count *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  local_bd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_bd0 = "";
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x1cb;
  file_55.m_begin = (iterator)&local_bd8;
  msg_55.m_end = pvVar6;
  msg_55.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_be8,
             msg_55);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"bloom,forcerelay,noban,relay,mempool@1.2.3.4/32","");
  _cVar7 = 0x502e8a;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"bloom,forcerelay,noban,relay,mempool@1.2.3.4/32\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_bf8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_bf0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_bf8,0x1cb);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x1cc;
  file_56.m_begin = (iterator)&local_c08;
  msg_56.m_end = pvVar6;
  msg_56.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_c18,
             msg_56);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"in,relay@1.2.3.4","");
  _cVar7 = 0x502fd3;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"in,relay@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c20 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_c28,0x1cc);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_c38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c30 = "";
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x1cd;
  file_57.m_begin = (iterator)&local_c38;
  msg_57.m_end = pvVar6;
  msg_57.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_c48,
             msg_57);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_228 = (char *)CONCAT44(local_228._4_4_,1);
  local_1e8[0] = (class_property<bool>)(class_property<bool>)(connection_direction == In);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae958;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&connection_direction;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8961,
             (size_t)&strings,0x1cd,(string *)local_58,"ConnectionDirection::In",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_c58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c50 = "";
  local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0x1ce;
  file_58.m_begin = (iterator)&local_c58;
  msg_58.m_end = pvVar6;
  msg_58.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_c68,
             msg_58);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"out,bloom@1.2.3.4","");
  _cVar7 = 0x50327c;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"out,bloom@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c70 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_c78,0x1ce);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_c88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_c80 = "";
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x1cf;
  file_59.m_begin = (iterator)&local_c88;
  msg_59.m_end = pvVar6;
  msg_59.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_c98,
             msg_59);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_1e8[0] = (class_property<bool>)(class_property<bool>)(connection_direction == Out);
  local_228 = (char *)CONCAT44(local_228._4_4_,BloomFilter);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae958;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&connection_direction;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8961,
             (size_t)&strings,0x1cf,(string *)local_58,"ConnectionDirection::Out",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_ca8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_ca0 = "";
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0x1d0;
  file_60.m_begin = (iterator)&local_ca8;
  msg_60.m_end = pvVar6;
  msg_60.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_cb8,
             msg_60);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"in,out,bloom@1.2.3.4","");
  _cVar7 = 0x50352a;
  bVar1 = NetWhitelistPermissions::TryParse
                    ((string *)local_58,&whitelistPermissions,&connection_direction,&error);
  local_578.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_578.m_message.px = (element_type *)0x0;
  local_578.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8._0_8_ =
       "NetWhitelistPermissions::TryParse(\"in,out,bloom@1.2.3.4\", whitelistPermissions, connection_direction, error)"
  ;
  local_1e8._8_8_ = "";
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abc70;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_cc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cc0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_208 = (NetWhitebindPermissions *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_578,(lazy_ostream *)&local_220,1,0,WARN,_cVar7,(size_t)&local_cc8,0x1d0);
  boost::detail::shared_count::~shared_count(&local_578.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_cd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cd0 = "";
  local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x1d1;
  file_61.m_begin = (iterator)&local_cd8;
  msg_61.m_end = pvVar6;
  msg_61.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_ce8,
             msg_61);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_228 = (char *)CONCAT44(local_228._4_4_,3);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1025812;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeb4cb3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_1f8;
  local_200 = (NetWhitebindPermissions *)&local_228;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013ae958;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = (NetWhitelistPermissions *)&connection_direction;
  local_1e8[0] = (class_property<bool>)(class_property<bool>)(connection_direction == Both);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8961,
             (size_t)&strings,0x1d1,(string *)local_58,"ConnectionDirection::Both",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  NetPermissions::ToStrings_abi_cxx11_(&strings,(NetPermissions *)0xfe,flags);
  local_cf8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_cf0 = "";
  local_d10._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0x1d4;
  file_62.m_begin = (iterator)&local_cf8;
  msg_62.m_end = pvVar6;
  msg_62.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)(local_d10 + 8),
             msg_62);
  local_578.m_message.px = (element_type *)((ulong)local_578.m_message.px & 0xffffffffffffff00);
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_560 = "";
  local_d10._0_8_ =
       (long)strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_200 = (NetWhitebindPermissions *)local_d10;
  local_228 = local_d14;
  local_d14[0] = '\a';
  local_d14[1] = '\0';
  local_d14[2] = '\0';
  local_d14[3] = '\0';
  local_1e8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0xe0);
  local_1e8._8_8_ = (element_type *)0x0;
  local_1e8._16_8_ = (sp_counted_base *)0x0;
  local_1f8 = (NetWhitelistPermissions *)0xeb4c4d;
  local_1f0 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abb70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_200;
  local_220.m_message.px = (element_type *)((ulong)local_220.m_message.px & 0xffffffffffffff00);
  local_220._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = (NetWhitebindPermissions *)&local_228;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)&local_578,1,2,REQUIRE,0xeb8aad,
             (size_t)&local_1f8,0x1d4,(string *)local_58,"7U",&local_220);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1e8 + 0x10));
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d20 = "";
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x1d5;
  file_63.m_begin = (iterator)&local_d28;
  msg_63.m_end = pvVar6;
  msg_63.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_d38,
             msg_63);
  _cVar7 = 0x50392a;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[12]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"bloomfilter");
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"bloomfilter\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8b11;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_d48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d40 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_d48,0x1d5);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_d58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d50 = "";
  local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0x1d6;
  file_64.m_begin = (iterator)&local_d58;
  msg_64.m_end = pvVar6;
  msg_64.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_d68,
             msg_64);
  _cVar7 = 0x503a0d;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"forcerelay");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"forcerelay\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8b5a;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_d78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d70 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_d78,0x1d6);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_d88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_d80 = "";
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0x1d7;
  file_65.m_begin = (iterator)&local_d88;
  msg_65.m_end = pvVar6;
  msg_65.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_d98,
             msg_65);
  _cVar7 = 0x503af0;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[6]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"relay");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"relay\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8b9e;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_da8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_da0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_da8,0x1d7);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_db8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_db0 = "";
  local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x1d8;
  file_66.m_begin = (iterator)&local_db8;
  msg_66.m_end = pvVar6;
  msg_66.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_dc8,
             msg_66);
  _cVar7 = 0x503bd3;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[6]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"noban");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"noban\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8be8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_dd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_dd0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_dd8,0x1d8);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_de8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_de0 = "";
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_67.m_end = (iterator)0x1d9;
  file_67.m_begin = (iterator)&local_de8;
  msg_67.m_end = pvVar6;
  msg_67.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_df8,
             msg_67);
  _cVar7 = 0x503cb3;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"mempool");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"mempool\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8c2e;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e00 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_e08,0x1d9);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_e18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e10 = "";
  local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x1da;
  file_68.m_begin = (iterator)&local_e18;
  msg_68.m_end = pvVar6;
  msg_68.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_e28,
             msg_68);
  _cVar7 = 0x503d8d;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[9]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"download");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"download\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8c75;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e30 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_e38,0x1da);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_e48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e40 = "";
  local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_69.m_end = (iterator)0x1db;
  file_69.m_begin = (iterator)&local_e48;
  msg_69.m_end = pvVar6;
  msg_69.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_e58,
             msg_69);
  _cVar7 = 0x503e67;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                    (strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"addr");
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (_Var4._M_current !=
       strings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "std::find(strings.begin(), strings.end(), \"addr\") != strings.end()";
  local_578.m_message.px = (element_type *)0xeb8cb8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e60 = "";
  local_48._8_8_ = (lazy_ostream *)&local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_58,1,0,WARN,_cVar7,(size_t)&local_e68,0x1db);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
  if (0x10 < download.m_service.super_CNetAddr.m_addr._size) {
    free(download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < download_noban.m_service.super_CNetAddr.m_addr._size) {
    free(download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    download_noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < noban_download.m_service.super_CNetAddr.m_addr._size) {
    free(noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    noban_download.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < noban.m_service.super_CNetAddr.m_addr._size) {
    free(noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    noban.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < whitelistPermissions.m_subnet.network.m_addr._size) {
    free(whitelistPermissions.m_subnet.network.m_addr._union.indirect_contents.indirect);
    whitelistPermissions.m_subnet.network.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < whitebindPermissions.m_service.super_CNetAddr.m_addr._size) {
    free(whitebindPermissions.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    whitebindPermissions.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.translated._M_dataplus._M_p != &error.translated.field_2) {
    operator_delete(error.translated._M_dataplus._M_p,
                    CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                             error.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.original._M_dataplus._M_p != &error.original.field_2) {
    operator_delete(error.original._M_dataplus._M_p,
                    CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                             error.original.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netpermissions_test)
{
    bilingual_str error;
    NetWhitebindPermissions whitebindPermissions;
    NetWhitelistPermissions whitelistPermissions;
    ConnectionDirection connection_direction;

    // Detect invalid white bind
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Cannot resolve -whitebind address") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("127.0.0.1", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Need to specify a port with -whitebind") != std::string::npos);
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("", whitebindPermissions, error));

    // If no permission flags, assume backward compatibility
    BOOST_CHECK(NetWhitebindPermissions::TryParse("1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    NetPermissions::ClearFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(!NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    NetPermissions::AddFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit);
    BOOST_CHECK(NetPermissions::HasFlag(whitebindPermissions.m_flags, NetPermissionFlags::Implicit));

    // Can set one permission
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    NetWhitebindPermissions noban, noban_download, download_noban, download;

    // "noban" implies "download"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban@1.2.3.4:32", noban, error));
    BOOST_CHECK_EQUAL(noban.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(NetPermissions::HasFlag(noban.m_flags, NetPermissionFlags::NoBan));

    // "noban,download" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("noban,download@1.2.3.4:32", noban_download, error));
    BOOST_CHECK_EQUAL(noban_download.m_flags, noban.m_flags);

    // "download,noban" is equivalent to "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download,noban@1.2.3.4:32", download_noban, error));
    BOOST_CHECK_EQUAL(download_noban.m_flags, noban.m_flags);

    // "download" excludes (does not imply) "noban"
    BOOST_REQUIRE(NetWhitebindPermissions::TryParse("download@1.2.3.4:32", download, error));
    BOOST_CHECK_EQUAL(download.m_flags, NetPermissionFlags::Download);
    BOOST_CHECK(NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::Download));
    BOOST_CHECK(!NetPermissions::HasFlag(download.m_flags, NetPermissionFlags::NoBan));

    // Happy path, can parse flags
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    // forcerelay should also activate the relay permission
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::Relay);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(NetWhitebindPermissions::TryParse("all@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::All);

    // Allow dups
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,noban,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan | NetPermissionFlags::Download); // "noban" implies "download"

    // Allow empty
    BOOST_CHECK(NetWhitebindPermissions::TryParse("bloom,relay,,noban@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::Relay | NetPermissionFlags::NoBan);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);
    BOOST_CHECK(NetWhitebindPermissions::TryParse(",,@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK_EQUAL(whitebindPermissions.m_flags, NetPermissionFlags::None);

    BOOST_CHECK(!NetWhitebindPermissions::TryParse("out,forcerelay@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("whitebind may only be used for incoming connections (\"out\" was passed)") != std::string::npos);

    // Detect invalid flag
    BOOST_CHECK(!NetWhitebindPermissions::TryParse("bloom,forcerelay,oopsie@1.2.3.4:32", whitebindPermissions, error));
    BOOST_CHECK(error.original.find("Invalid P2P permission") != std::string::npos);

    // Check netmask error
    BOOST_CHECK(!NetWhitelistPermissions::TryParse("bloom,forcerelay,noban@1.2.3.4:32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(error.original.find("Invalid netmask specified in -whitelist") != std::string::npos);

    // Happy path for whitelist parsing
    BOOST_CHECK(NetWhitelistPermissions::TryParse("noban@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::NoBan);
    BOOST_CHECK(NetPermissions::HasFlag(whitelistPermissions.m_flags, NetPermissionFlags::NoBan));

    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(whitelistPermissions.m_flags, NetPermissionFlags::BloomFilter | NetPermissionFlags::ForceRelay | NetPermissionFlags::NoBan | NetPermissionFlags::Relay);
    BOOST_CHECK(error.empty());
    BOOST_CHECK_EQUAL(whitelistPermissions.m_subnet.ToString(), "1.2.3.4/32");
    BOOST_CHECK(NetWhitelistPermissions::TryParse("bloom,forcerelay,noban,relay,mempool@1.2.3.4/32", whitelistPermissions, connection_direction, error));
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,relay@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::In);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Out);
    BOOST_CHECK(NetWhitelistPermissions::TryParse("in,out,bloom@1.2.3.4", whitelistPermissions, connection_direction, error));
    BOOST_CHECK_EQUAL(connection_direction, ConnectionDirection::Both);

    const auto strings = NetPermissions::ToStrings(NetPermissionFlags::All);
    BOOST_CHECK_EQUAL(strings.size(), 7U);
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "bloomfilter") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "forcerelay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "relay") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "noban") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "mempool") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "download") != strings.end());
    BOOST_CHECK(std::find(strings.begin(), strings.end(), "addr") != strings.end());
}